

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cmpa_16_i(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  uVar2 = (uint)(short)uVar1;
  uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c) + 0x20);
  m68ki_cpu.not_z_flag = uVar1 - uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = ((m68ki_cpu.not_z_flag ^ uVar1) & (uVar2 ^ uVar1)) >> 0x18;
  m68ki_cpu.c_flag =
       ((m68ki_cpu.not_z_flag | uVar2) & ~uVar1 | m68ki_cpu.not_z_flag & uVar2) >> 0x17;
  return;
}

Assistant:

static void m68k_op_cmpa_16_i(void)
{
	uint src = MAKE_INT_16(OPER_I_16());
	uint dst = AX;
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);
	FLAG_C = CFLAG_SUB_32(src, dst, res);
}